

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.t.cpp
# Opt level: O2

ostream * __thiscall
dynamicgraph::Signal<double,_int>::display(Signal<double,_int> *this,ostream *os)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(os,"Sig:");
  poVar1 = std::operator<<(poVar1,(string *)&(this->super_SignalBase<int>).name);
  std::operator<<(poVar1," (Type ");
  if ((ulong)this->signalType < 4) {
    std::operator<<(os,&DAT_0012d22c + *(int *)(&DAT_0012d22c + (ulong)this->signalType * 4));
  }
  poVar1 = std::operator<<(os,")");
  return poVar1;
}

Assistant:

std::ostream &Signal<T, Time>::display(std::ostream &os) const {
  os << "Sig:" << this->name << " (Type ";
  switch (this->signalType) {
    case Signal<T, Time>::CONSTANT:
      os << "Cst";
      break;
    case Signal<T, Time>::REFERENCE:
      os << "Ref";
      break;
    case Signal<T, Time>::REFERENCE_NON_CONST:
      os << "RefNonCst";
      break;
    case Signal<T, Time>::FUNCTION:
      os << "Fun";
      break;
  }
  return os << ")";
}